

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall
wallet::SQLiteDatabase::SQLiteDatabase
          (SQLiteDatabase *this,path *dir_path,path *file_path,DatabaseOptions *options,bool mock)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  long in_RCX;
  long *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  runtime_error *anon_var_0;
  int ret;
  int ret_1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe1c;
  path *in_stack_fffffffffffffe20;
  CSemaphore *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  char **in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  ConstevalFormatString<1U> in_stack_fffffffffffffec8;
  char *pcVar6;
  char *in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffee0 [15];
  string local_88 [32];
  string local_68 [32];
  string local_48 [8];
  Level in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_R8B & 1;
  WalletDatabase::WalletDatabase((WalletDatabase *)in_stack_fffffffffffffe28);
  *in_RDI = (long)&PTR__SQLiteDatabase_00cb2728;
  *(byte *)(in_RDI + 4) = bVar2 & 1;
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffe20);
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffe20);
  iVar3 = (int)((ulong)(in_RDI + 0xd) >> 0x20);
  CSemaphore::CSemaphore(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  in_RDI[0x19] = 0;
  *(byte *)(in_RDI + 0x1a) = *(byte *)(in_RCX + 0x39) & 1;
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffe58,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48
             ,(char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
             SUB41((uint)in_stack_fffffffffffffe38 >> 0x18,0));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),in_stack_fffffffffffffe30
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),in_stack_fffffffffffffe30
            );
  pcVar6 = "Using SQLite Version %s\n";
  SQLiteDatabaseVersion_abi_cxx11_();
  uVar5 = 2;
  logging_function._M_str._7_1_ = bVar2;
  logging_function._0_15_ = in_stack_fffffffffffffee0;
  source_file._M_str = in_stack_fffffffffffffed8;
  source_file._M_len = (size_t)pcVar6;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,iVar3,
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_ffffffffffffffc0
             ,in_stack_fffffffffffffec8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,uVar5));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),in_stack_fffffffffffffe30
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),in_stack_fffffffffffffe30
            );
  uVar5 = 2;
  logging_function_00._M_str._7_1_ = bVar2;
  logging_function_00._0_15_ = in_stack_fffffffffffffee0;
  source_file_00._M_str = in_stack_fffffffffffffed8;
  source_file_00._M_len = (size_t)pcVar6;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,iVar3,
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_ffffffffffffffc0
             ,(ConstevalFormatString<1U>)0x9766aa,in_stack_ffffffffffffffd0);
  g_sqlite_count = g_sqlite_count + 1;
  if (g_sqlite_count == 1) {
    iVar3 = sqlite3_config(0x10,ErrorLogCallback,0);
    if (iVar3 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      sqlite3_errstr(iVar3);
      tinyformat::format<char_const*>(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      std::runtime_error::runtime_error(prVar4,local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0032504b;
    }
    iVar3 = sqlite3_config(3);
    if (iVar3 != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      sqlite3_errstr(iVar3);
      tinyformat::format<char_const*>(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      std::runtime_error::runtime_error(prVar4,local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0032504b;
    }
  }
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)CONCAT44(in_stack_fffffffffffffe1c,uVar5))
    ;
    (**(code **)(*in_RDI + 0x10))();
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar6 = (char *)sqlite3_errstr(iVar3);
    tinyformat::format<char_const*>(pcVar6,(char **)prVar4);
    std::runtime_error::runtime_error(prVar4,local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_0032504b:
  __stack_chk_fail();
}

Assistant:

SQLiteDatabase::SQLiteDatabase(const fs::path& dir_path, const fs::path& file_path, const DatabaseOptions& options, bool mock)
    : WalletDatabase(), m_mock(mock), m_dir_path(fs::PathToString(dir_path)), m_file_path(fs::PathToString(file_path)), m_write_semaphore(1), m_use_unsafe_sync(options.use_unsafe_sync)
{
    {
        LOCK(g_sqlite_mutex);
        LogPrintf("Using SQLite Version %s\n", SQLiteDatabaseVersion());
        LogPrintf("Using wallet %s\n", m_dir_path);

        if (++g_sqlite_count == 1) {
            // Setup logging
            int ret = sqlite3_config(SQLITE_CONFIG_LOG, ErrorLogCallback, nullptr);
            if (ret != SQLITE_OK) {
                throw std::runtime_error(strprintf("SQLiteDatabase: Failed to setup error log: %s\n", sqlite3_errstr(ret)));
            }
            // Force serialized threading mode
            ret = sqlite3_config(SQLITE_CONFIG_SERIALIZED);
            if (ret != SQLITE_OK) {
                throw std::runtime_error(strprintf("SQLiteDatabase: Failed to configure serialized threading mode: %s\n", sqlite3_errstr(ret)));
            }
        }
        int ret = sqlite3_initialize(); // This is a no-op if sqlite3 is already initialized
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to initialize SQLite: %s\n", sqlite3_errstr(ret)));
        }
    }

    try {
        Open();
    } catch (const std::runtime_error&) {
        // If open fails, cleanup this object and rethrow the exception
        Cleanup();
        throw;
    }
}